

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_add_item_to_object_or_array_should_not_add_itself(void)

{
  cJSON_bool cVar1;
  cJSON *object;
  cJSON *item;
  
  object = cJSON_CreateObject();
  item = cJSON_CreateArray();
  cVar1 = cJSON_AddItemToObject(object,"key",object);
  if (cVar1 != 0) {
    UnityFail("add an object to itself should fail",0x22c);
  }
  cJSON_Delete(object);
  cJSON_Delete(item);
  return;
}

Assistant:

static void cjson_add_item_to_object_or_array_should_not_add_itself(void)
{
    cJSON *object = cJSON_CreateObject();
    cJSON *array = cJSON_CreateArray();
    cJSON_bool flag = false;

    flag = cJSON_AddItemToObject(object, "key", object);
    TEST_ASSERT_FALSE_MESSAGE(flag, "add an object to itself should fail");

    flag = cJSON_AddItemToArray(array, array);
    TEST_ASSERT_FALSE_MESSAGE(flag, "add an array to itself should fail");

    cJSON_Delete(object);
    cJSON_Delete(array);
}